

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  
  setlocale(6,"");
  iVar2 = 5;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_70b);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Shopenhauer!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_737);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Goethe!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Schiler!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Richard Wagner!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Georges Bizet!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Peter gast");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_7af);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_7c5);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Kant");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Parmenides");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Hegel");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Richard Wagner!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_805);
  std::operator<<((ostream *)&std::cout,"Com Richard Wagner, quando percebeu o nome ");
  std::operator<<((ostream *)&std::cout,"Dele ligado ao antisemitismo e outros ");
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_847);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    setlocale(LC_ALL, "");

    for (int i = 0; i < 5; i++)
    {

        cout << "Heráclito!" << endl;
        cout << "Shopenhauer!" << endl;
        cout << "Lou Salomé!" << endl;
        cout << "Goethe!" << endl;
        cout << "Schiler!" << endl;
        cout << "Richard Wagner!" << endl;
        cout << "Georges Bizet!" << endl;
        cout << "Peter gast" << endl;
        cout << "São Inspirações Nietzscheanas!" << endl;
    }

    cout << endl
         << endl;
    cout << "Anti inspirações Nietzscheanas!" << endl;
    cout << "Kant" << endl;
    cout << "Parmenides" << endl;
    cout << "Hegel" << endl;
    cout << "Richard Wagner!" << endl;
    cout << endl
         << endl;
    cout << "P.S: Nietzsche sofreu uma séria decepção ";
    cout << "Com Richard Wagner, quando percebeu o nome ";
    cout << "Dele ligado ao antisemitismo e outros ";
    cout << "preconceitos da época.";

    return 0;
}